

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::V5::WillMessage::readFrom(WillMessage *this,uint8 *buffer,uint32 bufLength)

{
  bool bVar1;
  uint32 value;
  int iVar2;
  uint32 o;
  uint32 s;
  uint32 bufLength_local;
  uint8 *buffer_local;
  WillMessage *this_local;
  
  value = Properties::readFrom(&this->willProperties,buffer,bufLength);
  bVar1 = Common::isError(value);
  this_local._4_4_ = value;
  if (!bVar1) {
    this_local._4_4_ =
         Common::DynamicString::readFrom(&this->willTopic,buffer + value,bufLength - value);
    bVar1 = Common::isError(this_local._4_4_);
    if (!bVar1) {
      iVar2 = this_local._4_4_ + value;
      this_local._4_4_ =
           Common::DynamicBinaryData::readFrom
                     (&this->willPayload,buffer + value + this_local._4_4_,
                      (bufLength - value) - this_local._4_4_);
      bVar1 = Common::isError(this_local._4_4_);
      if (!bVar1) {
        this_local._4_4_ = this_local._4_4_ + iVar2;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

virtual uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    uint32 s = willProperties.readFrom(buffer, bufLength), o = 0;
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    s = willTopic.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s; buffer += s; bufLength -= s;
                    s = willPayload.readFrom(buffer, bufLength);
                    if (isError(s)) return s;
                    o += s;
                    return o;
                }